

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::Derive
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Input)

{
  int *Lines;
  long lVar1;
  pointer piVar2;
  FeedForwardNN<double> *pFVar3;
  uint uVar4;
  int iVar5;
  double *e;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  pointer pdVar8;
  pointer piVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  int ip;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int j;
  long lVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  uint local_22c;
  vector<double,std::allocator<double>> *local_228;
  Matrix<double> S;
  Matrix<double> Sigma;
  int local_1cc;
  Matrix<double> local_1c8;
  FeedForwardNN<double> *local_1a8;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *local_1a0;
  Matrix<double> M;
  vector<double,_std::allocator<double>_> zl;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  y;
  vector<double,_std::allocator<double>_> entries;
  vector<double,_std::allocator<double>_> ylmo;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  z;
  function<double_(const_double_&)> local_b0;
  function<double_(const_double_&)> local_90;
  function<double_(const_double_&)> local_70;
  function<double_(const_double_&)> local_50;
  
  local_228 = (vector<double,std::allocator<double>> *)__return_storage_ptr__;
  if (*(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start !=
      (int)((ulong)((long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&y,"Derive: the number of inputs does not match the number of input nodes."
               ,(allocator<char> *)&z);
    Error((string *)&y);
    std::__cxx11::string::~string((string *)&y);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_228,
             (long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1] * ((long)this->_Np + 1),
             (allocator_type *)&y);
  piVar9 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  y._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &y._M_t._M_impl.super__Rb_tree_header._M_header;
  y._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  y._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  y._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  z._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &z._M_t._M_impl.super__Rb_tree_header._M_header;
  z._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  z._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  z._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  S._Lines = (int)((ulong)((long)(Input->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                .super__Vector_impl_data._M_start) >> 3);
  local_1c8._Lines = 1;
  y._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       y._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  z._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       z._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Matrix<double>::Matrix(&M,&S._Lines,&local_1c8._Lines,Input);
  Sigma._Lines = 0;
  Matrix<double>::Matrix((Matrix<double> *)&Sigma._Matrix,&M);
  std::
  _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
  ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
            ((_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
              *)&y,(pair<const_int,_nnad::Matrix<double>_> *)&Sigma);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&M._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  iVar5 = (int)((ulong)((long)piVar9 - (long)piVar2) >> 2);
  uVar4 = iVar5 - 1;
  local_1a0 = &this->_Links;
  local_1a8 = this;
  for (local_1c8._Lines = 1; local_1c8._Lines < (int)uVar4; local_1c8._Lines = local_1c8._Lines + 1)
  {
    pmVar6 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(local_1a0,&local_1c8._Lines);
    S._Lines = local_1c8._Lines + -1;
    pmVar7 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(&y,&S._Lines);
    Matrix<double>::operator*(&Sigma,pmVar6,pmVar7);
    pmVar6 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(&this->_Biases,&local_1c8._Lines);
    Matrix<double>::operator+(&M,&Sigma,pmVar6);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>);
    std::function<double_(const_double_&)>::function(&local_50,&this->_ActFun);
    Matrix<double>::Matrix(&S,&M,&local_50);
    Sigma._Lines = local_1c8._Lines;
    Matrix<double>::Matrix((Matrix<double> *)&Sigma._Matrix,&S);
    std::
    _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
    ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
              ((_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
                *)&y,(pair<const_int,_nnad::Matrix<double>_> *)&Sigma);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S._Matrix.super__Vector_base<double,_std::allocator<double>_>);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::function<double_(const_double_&)>::function(&local_70,&this->_dActFun);
    Matrix<double>::Matrix(&S,&M,&local_70);
    Sigma._Lines = local_1c8._Lines;
    Matrix<double>::Matrix((Matrix<double> *)&Sigma._Matrix,&S);
    std::
    _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
    ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
              ((_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
                *)&z,(pair<const_int,_nnad::Matrix<double>_> *)&Sigma);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S._Matrix.super__Vector_base<double,_std::allocator<double>_>);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&M._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  }
  S._Lines = uVar4;
  pmVar6 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at(local_1a0,&S._Lines);
  local_1c8._Lines = iVar5 + -2;
  pmVar7 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at(&y,&local_1c8._Lines);
  Matrix<double>::operator*(&Sigma,pmVar6,pmVar7);
  zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar4;
  pmVar6 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at(&this->_Biases,(key_type *)&zl);
  Matrix<double>::operator+(&M,&Sigma,pmVar6);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::function<double_(const_double_&)>::function(&local_90,&local_1a8->_OutputActFun);
  Matrix<double>::Matrix(&S,&M,&local_90);
  Sigma._Lines = uVar4;
  Matrix<double>::Matrix((Matrix<double> *)&Sigma._Matrix,&S);
  std::
  _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
  ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
            ((_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
              *)&y,(pair<const_int,_nnad::Matrix<double>_> *)&Sigma);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&S._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::function<double_(const_double_&)>::function(&local_b0,&local_1a8->_dOutputActFun);
  Matrix<double>::Matrix(&S,&M,&local_b0);
  Sigma._Lines = uVar4;
  Matrix<double>::Matrix((Matrix<double> *)&Sigma._Matrix,&S);
  std::
  _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
  ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
            ((_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
              *)&z,(pair<const_int,_nnad::Matrix<double>_> *)&Sigma);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&S._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  S._Lines = uVar4;
  pmVar6 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at(&y,&S._Lines);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&Sigma,&pmVar6->_Matrix);
  pdVar8 = (pointer)CONCAT44(Sigma._Columns,Sigma._Lines);
  pdVar11 = *(double **)local_228;
  uVar16 = (ulong)((long)Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start - (long)pdVar8) >> 3;
  for (; pdVar8 != Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start; pdVar8 = pdVar8 + 1) {
    *pdVar11 = *pdVar8;
    pdVar11 = pdVar11 + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&Sigma);
  pFVar3 = local_1a8;
  piVar9 = (local_1a8->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = piVar9[(int)uVar4];
  local_1c8._Lines = 0;
  local_1c8._Columns = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&S,(ulong)(uint)(iVar5 * iVar5),
             (value_type_conflict1 *)&local_1c8,(allocator_type *)&zl);
  Lines = piVar9 + (int)uVar4;
  Matrix<double>::Matrix(&Sigma,Lines,Lines,(vector<double,_std::allocator<double>_> *)&S);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&S);
  iVar5 = 0;
  while (local_1c8._Lines = iVar5,
        iVar5 < (pFVar3->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar4]) {
    S._Lines = 0;
    S._Columns = 0x3ff00000;
    Matrix<double>::SetElement(&Sigma,&local_1c8._Lines,&local_1c8._Lines,(double *)&S);
    iVar5 = local_1c8._Lines + 1;
  }
  for (local_22c = uVar4; 0 < (int)local_22c; local_22c = local_22c - 1) {
    pmVar6 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(&z,(key_type *)&local_22c);
    std::vector<double,_std::allocator<double>_>::vector(&zl,&pmVar6->_Matrix);
    S._Lines = local_22c - 1;
    pmVar6 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(&y,&S._Lines);
    std::vector<double,_std::allocator<double>_>::vector(&ylmo,&pmVar6->_Matrix);
    uVar12 = (ulong)local_22c;
    piVar9 = (pFVar3->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar10 = 0; S._Lines = (int)uVar10, (int)uVar10 < piVar9[(int)uVar12];
        uVar10 = (ulong)((int)uVar10 + 1)) {
      uVar16 = (ulong)(int)uVar16;
      iVar5 = 0;
      while (local_1c8._Lines = iVar5, iVar5 < piVar9[(int)uVar4]) {
        dVar20 = Matrix<double>::GetElement(&Sigma,&local_1c8._Lines,&S._Lines);
        uVar10 = (ulong)S._Lines;
        *(double *)(*(long *)local_228 + uVar16 * 8) =
             dVar20 * *(double *)
                       (CONCAT44(zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (uint)zl.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar10 * 8);
        uVar16 = uVar16 + 1;
        piVar9 = (pFVar3->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = local_1c8._Lines + 1;
      }
      for (lVar17 = 0; uVar12 = (ulong)(int)local_22c, lVar17 < piVar9[uVar12 - 1];
          lVar17 = lVar17 + 1) {
        uVar16 = (ulong)(int)uVar16;
        iVar5 = 0;
        while (local_1c8._Lines = iVar5, iVar5 < piVar9[(int)uVar4]) {
          dVar20 = Matrix<double>::GetElement(&Sigma,&local_1c8._Lines,&S._Lines);
          uVar10 = (ulong)S._Lines;
          *(double *)(*(long *)local_228 + uVar16 * 8) =
               dVar20 * *(double *)
                         (CONCAT44(zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (uint)zl.super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_start) + uVar10 * 8) *
               ylmo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar17];
          uVar16 = uVar16 + 1;
          piVar9 = (pFVar3->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar5 = local_1c8._Lines + 1;
        }
      }
    }
    entries.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    entries.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    entries.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar5 = 0;
    while( true ) {
      local_1c8._Lines = iVar5;
      lVar17 = (long)(int)uVar12;
      if (piVar9[lVar17] <= iVar5) break;
      for (local_1cc = 0; local_1cc < piVar9[(long)(int)uVar12 + -1]; local_1cc = local_1cc + 1) {
        dVar20 = *(double *)
                  (CONCAT44(zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) + (long)local_1c8._Lines * 8);
        pmVar6 = std::
                 map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                 ::at(local_1a0,(key_type *)&local_22c);
        dVar21 = Matrix<double>::GetElement(pmVar6,&local_1c8._Lines,&local_1cc);
        S._0_8_ = dVar20 * dVar21;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&entries,(double *)&S);
        uVar12 = (ulong)local_22c;
        piVar9 = (pFVar3->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar5 = local_1c8._Lines + 1;
    }
    Matrix<double>::Matrix(&S,piVar9 + lVar17,piVar9 + lVar17 + -1,&entries);
    Matrix<double>::operator*(&local_1c8,&Sigma,&S);
    Matrix<double>::operator=(&Sigma,&local_1c8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_1c8._Matrix.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S._Matrix.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&entries.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&ylmo.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&zl.super__Vector_base<double,_std::allocator<double>_>);
  }
  if ((pFVar3->_Preproc).super__Function_base._M_manager != (_Manager_type)0x0) {
    iVar5 = (pFVar3->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    for (iVar14 = 0; iVar14 < pFVar3->_NpPrep; iVar14 = iVar14 + 1) {
      std::vector<double,std::allocator<double>>::
      insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                (local_228,(const_iterator)*(double **)(local_228 + 8),
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 *(double **)local_228,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 (*(double **)local_228 + iVar5));
    }
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()((vector<double,_std::allocator<double>_> *)&S,&pFVar3->_Preproc,Input,
                 &pFVar3->_PreprocPars);
    lVar17 = (long)iVar5 * 8;
    lVar18 = -1;
    lVar15 = 0;
    while( true ) {
      lVar18 = lVar18 + 1;
      if (pFVar3->_Np < lVar18) break;
      std::
      transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
                (lVar15 + *(long *)local_228,lVar15 + *(long *)local_228 + lVar17,S._0_8_);
      lVar15 = lVar15 + lVar17;
    }
    lVar18 = (long)(pFVar3->_Np + 1);
    lVar19 = lVar17 * lVar18;
    lVar15 = (lVar18 + 1) * lVar17;
    for (; lVar18 <= (long)pFVar3->_NpPrep + (long)pFVar3->_Np; lVar18 = lVar18 + 1) {
      lVar1 = *(long *)local_228 + lVar19;
      lVar13 = *(long *)local_228 + lVar15;
      lVar19 = lVar19 + lVar17;
      lVar15 = lVar15 + lVar17;
      std::
      transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
                (lVar1,lVar13,(long)(((int)lVar18 - pFVar3->_Np) * iVar5) * 8 + S._0_8_);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&S);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Sigma._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&M._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_nnad::Matrix<double>_>,_std::_Select1st<std::pair<const_int,_nnad::Matrix<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::~_Rb_tree(&z._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_nnad::Matrix<double>_>,_std::_Select1st<std::pair<const_int,_nnad::Matrix<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::~_Rb_tree(&y._M_t);
  return (vector<double,_std::allocator<double>_> *)local_228;
}

Assistant:

std::vector<T> Derive(std::vector<T> const& Input) const
    {
      // Check that the size of the input vector is equal to the number of
      // input nodes.
      if ((int) Input.size() != _Arch[0])
        Error("Derive: the number of inputs does not match the number of input nodes.");

      // Initialise dNN vector
      std::vector<T> dNN((_Np + 1) * _Arch.back());

      // Element counter
      int count = 0;

      // Number of layers
      const int nl = (int) _Arch.size();

      // Compute NN recursively and save the quantities that will be
      // needed to compute the derivatives.
      std::map<int, Matrix<T>> y;
      std::map<int, Matrix<T>> z;
      y.insert({0, Matrix<T>{(int) Input.size(), 1, Input}});
      for (int l = 1; l < nl - 1; l++)
        {
          const Matrix<T> M = _Links.at(l) * y.at(l - 1) + _Biases.at(l);
          y.insert({l, Matrix<T>{M, _ActFun}});
          z.insert({l, Matrix<T>{M, _dActFun}});
        }

      // Now take care of the output layer according to the selected
      // output function.
      const Matrix<T> M = _Links.at(nl - 1) * y.at(nl - 2) + _Biases.at(nl - 1);
      y.insert({nl - 1, Matrix<T>{M, _OutputActFun}});
      z.insert({nl - 1, Matrix<T>{M, _dOutputActFun}});

      // Output vector of vectors. Push back NN itself as a first
      // element.
      for (auto const& e : y.at(nl - 1).GetVector())
        dNN[count++] = e;

      // First compute the Sigma matrix on the output layer that is just
      // the unity matrix.
      Matrix<T> Sigma(_Arch[nl - 1], _Arch[nl - 1], std::vector<T>(_Arch[nl - 1] * _Arch[nl - 1], T(0.)));
      for (int k = 0; k < _Arch[nl - 1]; k++)
        Sigma.SetElement(k, k, T(1));

      // Now run backwards on the layers to compute the derivatives
      for (int l = nl - 1; l > 0; l--)
        {
          const std::vector<T> zl = z.at(l).GetVector();
          const std::vector<T> ylmo = y.at(l - 1).GetVector();
          for (int i = 0; i < _Arch[l]; i++)
            {
              // Compute derivatives w.r.t. the biases
              for (int k = 0; k < _Arch[nl - 1]; k++)
                dNN[count++] = Sigma.GetElement(k, i) * zl[i];

              // Compute derivatives w.r.t. the links
              for (int j = 0; j < _Arch[l - 1]; j++)
                for (int k = 0; k < _Arch[nl - 1]; k++)
                  dNN[count++] = Sigma.GetElement(k, i) * zl[i] * ylmo[j];
            }

          // Compute Matrix "S" on this layer
          std::vector<T> entries;
          for (int i = 0; i < _Arch[l]; i++)
            for (int j = 0; j < _Arch[l - 1]; j++)
              entries.push_back(zl[i] * _Links.at(l).GetElement(i, j));
          const Matrix<T> S{_Arch[l], _Arch[l - 1], entries};

          // Update Matrix "Sigma" for the next step
          Sigma = Sigma * S;
        }

      // Include preprocessing function if necessary
      if (_Preproc != nullptr)
        {
          // Get number of outputs
          const int Nout = _Arch.back();

          // Append to the vector dNN the NN mupliplied by the
          // derivative of the preprocessing function.
          for (int ip = 0; ip < _NpPrep; ip++)
            dNN.insert(dNN.end(), dNN.begin(), dNN.begin() + Nout);

          // Get preprocessing function
          const std::vector<T> prep = _Preproc(Input, _PreprocPars);

          // Multiply dNN by the preprocessing function, i.e. the
          // first Nout outputs of prep.
          for (int ip = 0; ip < _Np + 1; ip++)
            std::transform(dNN.begin() + Nout * ip, dNN.begin() + Nout * ( ip + 1 ), prep.begin(), dNN.begin() + Nout * ip, std::multiplies<T>());

          // Now multiply the last _NpPrep bunches of Nout entries of
          // dNN (that for now only contain _NpPrep copies the NN
          // itself) by the _NpPrep derivatives of the preprocessing
          // function.
          for (int ip = _Np + 1; ip < _Np + _NpPrep + 1; ip++)
            std::transform(dNN.begin() + Nout * ip, dNN.begin() + Nout * ( ip + 1 ), prep.begin() + Nout * ( ip - _Np ), dNN.begin() + Nout * ip, std::multiplies<T>());
        }

      return dNN;
    }